

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O2

void __thiscall
ReplayingHammerer::run_code_jitting_probing(ReplayingHammerer *this,PatternAddressMapper *mapper)

{
  bool sync_each_ref;
  int aggressors_for_sync;
  string *__k;
  size_t sVar1;
  long lVar2;
  char *args;
  uint num_activations;
  string local_b0;
  string local_90;
  PatternAddressMapper *local_70;
  HammeringPattern *local_68;
  FuzzingParameterSet *local_60;
  ReplayingHammerer *local_58;
  CodeJitter *local_50;
  long local_48;
  int local_3c [2];
  allocator<char> local_31;
  
  local_50 = PatternAddressMapper::get_code_jitter(mapper);
  local_70 = mapper;
  __k = PatternAddressMapper::get_instance_id_abi_cxx11_(mapper);
  local_68 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->map_mapping_id_to_pattern,__k);
  local_3c[0]._0_2_ = 1;
  local_60 = &this->params;
  lVar2 = 0;
  local_58 = this;
  while (lVar2 != 2) {
    sync_each_ref = *(bool *)((long)local_3c + lVar2);
    local_48 = lVar2;
    sVar1 = hammer_pattern(local_58,local_60,local_50,local_68,local_70,local_50->flushing_strategy,
                           local_50->fencing_strategy,(long)local_58->hammering_num_reps,
                           local_50->num_aggs_for_sync,local_50->total_activations,false,
                           sync_each_ref,false,false,false,true,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"sync_each_ref = %-8s => %d bit flips",&local_31);
    args = "false";
    if (sync_each_ref != false) {
      args = "true";
    }
    format_string<char_const*,unsigned_long>(&local_b0,&local_90,args,sVar1);
    Logger::log_info(&local_b0,true);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    lVar2 = local_48 + 1;
  }
  local_3c[0] = 1;
  local_3c[1] = 2;
  lVar2 = 0;
  while (lVar2 != 8) {
    aggressors_for_sync = *(int *)((long)local_3c + lVar2);
    local_48 = lVar2;
    sVar1 = hammer_pattern(local_58,local_60,local_50,local_68,local_70,local_50->flushing_strategy,
                           local_50->fencing_strategy,(long)local_58->hammering_num_reps,
                           aggressors_for_sync,local_50->total_activations,false,
                           local_50->pattern_sync_each_ref,false,false,false,true,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"num_aggs_for_sync = %-7d => %d bit flips",&local_31);
    format_string<int,unsigned_long>(&local_b0,&local_90,aggressors_for_sync,sVar1);
    Logger::log_info(&local_b0,true);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    lVar2 = local_48 + 4;
  }
  for (num_activations = 10000000; 1000000 < num_activations;
      num_activations = num_activations - 1000000) {
    sVar1 = hammer_pattern(local_58,local_60,local_50,local_68,local_70,local_50->flushing_strategy,
                           local_50->fencing_strategy,(long)local_58->hammering_num_reps,
                           local_50->num_aggs_for_sync,num_activations,false,
                           local_50->pattern_sync_each_ref,false,false,false,true,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"total_num_acts_hammering = %-12d => %d bit flips",
               (allocator<char> *)local_3c);
    format_string<int,unsigned_long>(&local_b0,&local_90,num_activations,sVar1);
    Logger::log_info(&local_b0,true);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

[[maybe_unused]] void ReplayingHammerer::run_code_jitting_probing(PatternAddressMapper &mapper) {
  auto &cj = mapper.get_code_jitter();
  auto &patt = map_mapping_id_to_pattern.at(mapper.get_instance_id());

  // - FLUSHING_STRATEGY / FENCING_STRATEGY
//      for (const auto &ff_strategy : get_valid_strategies()) {
//        auto num_bit_flips = hammer_pattern(mem, params, jitter, patt, mapper, ff_strategy.first, ff_strategy.second,
//            hammering_num_reps, sync_each_ref, num_sync_aggs, total_acts, false, verbose_memcheck, verbose_params);
//        Logger::log_info(format_string("FLUSHING_STRATEGY = %-17s, FENCING_STRATEGY = %-19s => %d bit flips",
//            to_string(ff_strategy.first).c_str(), to_string(ff_strategy.second).c_str(), num_bit_flips));
//      }

  // - sync_each_ref
  for (auto &sync : {true, false}) {
    auto num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy,
        hammering_num_reps, cj.num_aggs_for_sync, cj.total_activations, false, sync, false, false, false,
        true, true);
    Logger::log_info(format_string("sync_each_ref = %-8s => %d bit flips",
        (sync ? "true" : "false"), num_bit_flips));
  }

  // - num_aggs_for_sync
  for (const auto &sync_aggs : {1, 2}) {
    auto num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy,
        hammering_num_reps, sync_aggs, cj.total_activations, false, cj.pattern_sync_each_ref, false, false,
        false, true, true);
    Logger::log_info(format_string("num_aggs_for_sync = %-7d => %d bit flips", sync_aggs, num_bit_flips));
  }

  // - hammering_total_num_activations
  for (int a = M(10); a > M(1); a -= M(1)) {
    auto num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy,
        hammering_num_reps, cj.num_aggs_for_sync, a, false, cj.pattern_sync_each_ref, false, false, false,
        true, true);
    Logger::log_info(format_string("total_num_acts_hammering = %-12d => %d bit flips", a, num_bit_flips));
  }
}